

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

int64_t __thiscall
aeron::ClientConductor::addCounter
          (ClientConductor *this,int32_t typeId,uint8_t *keyBuffer,size_t keyLength,string *label)

{
  _Alloc_hider _Var1;
  int iVar2;
  SourcedException *pSVar3;
  char *pcVar4;
  int64_t registrationId;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  verifyDriverIsActive(this);
  ensureOpen(this);
  if (0x70 < keyLength) {
    pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_70,keyLength);
    std::operator+(&local_b0,"key length out of bounds: ",&local_70);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "std::int64_t aeron::ClientConductor::addCounter(std::int32_t, const std::uint8_t *, std::size_t, const std::string &)"
               ,"");
    pcVar4 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                              );
    std::__cxx11::string::string((string *)&local_50,pcVar4,&local_b1);
    util::SourcedException::SourcedException(pSVar3,&local_b0,&local_90,&local_50,0x142);
    *(undefined ***)pSVar3 = &PTR__SourcedException_00163a98;
    __cxa_throw(pSVar3,&util::IllegalArgumentException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  if (0x17c < label->_M_string_length) {
    pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_70,label->_M_string_length);
    std::operator+(&local_b0,"label length out of bounds: ",&local_70);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "std::int64_t aeron::ClientConductor::addCounter(std::int32_t, const std::uint8_t *, std::size_t, const std::string &)"
               ,"");
    pcVar4 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                              );
    std::__cxx11::string::string((string *)&local_50,pcVar4,&local_b1);
    util::SourcedException::SourcedException(pSVar3,&local_b0,&local_90,&local_50,0x147);
    *(undefined ***)pSVar3 = &PTR__SourcedException_00163a98;
    __cxa_throw(pSVar3,&util::IllegalArgumentException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  local_b0._M_dataplus._M_p =
       (pointer)DriverProxy::addCounter(this->m_driverProxy,typeId,keyBuffer,keyLength,label);
  if ((this->m_epochClock).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_70._M_dataplus._M_p =
         (pointer)(*(this->m_epochClock)._M_invoker)((_Any_data *)&this->m_epochClock);
    std::
    vector<aeron::ClientConductor::CounterStateDefn,std::allocator<aeron::ClientConductor::CounterStateDefn>>
    ::emplace_back<long&,long_long>
              ((vector<aeron::ClientConductor::CounterStateDefn,std::allocator<aeron::ClientConductor::CounterStateDefn>>
                *)&this->m_counters,(long *)&local_b0,(longlong *)&local_70);
    _Var1._M_p = local_b0._M_dataplus._M_p;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
    return (int64_t)_Var1._M_p;
  }
  std::__throw_bad_function_call();
}

Assistant:

std::int64_t ClientConductor::addCounter(
    std::int32_t typeId, const std::uint8_t *keyBuffer, std::size_t keyLength, const std::string& label)
{
    verifyDriverIsActive();
    ensureOpen();

    if (keyLength > CountersManager::MAX_KEY_LENGTH)
    {
        throw IllegalArgumentException("key length out of bounds: " + std::to_string(keyLength), SOURCEINFO);
    }

    if (label.length() > CountersManager::MAX_LABEL_LENGTH)
    {
        throw IllegalArgumentException("label length out of bounds: " + std::to_string(label.length()), SOURCEINFO);
    }

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    std::int64_t registrationId = m_driverProxy.addCounter(typeId, keyBuffer, keyLength, label);

    m_counters.emplace_back(registrationId, m_epochClock());

    return registrationId;
}